

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::ByteSizeLong
          (CustomModel_CustomModelParamValue *this)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  undefined8 *puVar6;
  uint uVar7;
  bool bVar8;
  
  uVar1 = this->_oneof_case_[0];
  sVar5 = 0;
  if ((int)uVar1 < 0x28) {
    if (uVar1 == 10) {
      sVar5 = 9;
      goto LAB_0033c4bb;
    }
    bVar8 = uVar1 == 0x14;
    if (!bVar8) {
      if (uVar1 == 0x1e) {
        uVar4 = (ulong)(int)((this->value_).intvalue_ | 1);
        lVar3 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        sVar5 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 2;
      }
      goto LAB_0033c4bb;
    }
  }
  else {
    if (uVar1 == 0x28) {
      uVar4 = (this->value_).longvalue_ | 1;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar5 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 2;
      goto LAB_0033c4bb;
    }
    if (uVar1 == 0x32) {
      sVar5 = 3;
      goto LAB_0033c4bb;
    }
    bVar8 = uVar1 == 0x3c;
    if (!bVar8) goto LAB_0033c4bb;
  }
  if (bVar8) {
    puVar6 = (undefined8 *)((this->value_).longvalue_ & 0xfffffffffffffffe);
  }
  else {
    puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  uVar7 = (uint)puVar6[1] | 1;
  iVar2 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar5 = puVar6[1] + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
LAB_0033c4bb:
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

inline CustomModel_CustomModelParamValue::ValueCase CustomModel_CustomModelParamValue::value_case() const {
  return CustomModel_CustomModelParamValue::ValueCase(_oneof_case_[0]);
}